

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::HasError(WastParser *this)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  WastParser *this_local;
  
  iVar2 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::begin(this->errors_);
  iVar3 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::end(this->errors_);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<wabt::Error*,std::vector<wabt::Error,std::allocator<wabt::Error>>>,wabt::WastParser::HasError()const::__0>
                    (iVar2._M_current,iVar3._M_current);
  return bVar1;
}

Assistant:

bool WastParser::HasError() const {
  return std::any_of(errors_->begin(), errors_->end(), [](const auto& x) {
    return x.error_level == ErrorLevel::Error;
  });
}